

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udataswp.cpp
# Opt level: O1

int32_t uprv_swapArray16(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                        UErrorCode *pErrorCode)

{
  int iVar1;
  long lVar2;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (U_ZERO_ERROR < *pErrorCode)) {
    return 0;
  }
  if ((-1 < length && (inData != (void *)0x0 && ds != (UDataSwapper *)0x0)) &&
     ((length & 1U) == 0 && outData != (void *)0x0)) {
    if (length != 0) {
      iVar1 = ((uint)length >> 1) + 1;
      lVar2 = 0;
      do {
        *(ushort *)((long)outData + lVar2) =
             *(ushort *)((long)inData + lVar2) << 8 | *(ushort *)((long)inData + lVar2) >> 8;
        iVar1 = iVar1 + -1;
        lVar2 = lVar2 + 2;
      } while (1 < iVar1);
    }
    return length;
  }
  *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  return 0;
}

Assistant:

static int32_t U_CALLCONV
uprv_swapArray16(const UDataSwapper *ds,
                 const void *inData, int32_t length, void *outData,
                 UErrorCode *pErrorCode) {
    const uint16_t *p;
    uint16_t *q;
    int32_t count;
    uint16_t x;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<0 || (length&1)!=0 || outData==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* setup and swapping */
    p=(const uint16_t *)inData;
    q=(uint16_t *)outData;
    count=length/2;
    while(count>0) {
        x=*p++;
        *q++=(uint16_t)((x<<8)|(x>>8));
        --count;
    }

    return length;
}